

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verCore.c
# Opt level: O2

int Ver_ParseConstant(Ver_Man_t *pMan,char *pWord)

{
  byte bVar1;
  uint uVar2;
  char cVar3;
  void *Entry;
  Vec_Ptr_t *p;
  ulong uVar4;
  char *pcVar5;
  ulong uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  
  cVar3 = *pWord;
  if ((cVar3 < '1') || ('9' < pWord[1])) {
    __assert_fail("pWord[0] >= \'1\' && pWord[1] <= \'9\'",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/ver/verCore.c"
                  ,0x2f4,"int Ver_ParseConstant(Ver_Man_t *, char *)");
  }
  uVar2 = atoi(pWord);
  while (pcVar5 = pWord + 1, cVar3 != '\0') {
    if (cVar3 == '\'') {
      if (*pcVar5 == 'b') {
        pMan->vNames->nSize = 0;
        uVar4 = 0;
        uVar6 = (ulong)uVar2;
        if ((int)uVar2 < 1) {
          uVar6 = uVar4;
        }
        goto LAB_002ae16b;
      }
      builtin_strncpy(pMan->sError + 0x10,"ly handle binary constants.",0x1c);
      uVar7._0_1_ = 'C';
      uVar7._1_1_ = 'u';
      uVar7._2_1_ = 'r';
      uVar7._3_1_ = 'r';
      uVar8._0_1_ = 'e';
      uVar8._1_1_ = 'n';
      uVar8._2_1_ = 't';
      uVar8._3_1_ = 'l';
      uVar9._0_1_ = 'y';
      uVar9._1_1_ = ' ';
      uVar9._2_1_ = 'c';
      uVar9._3_1_ = 'a';
      uVar10._0_1_ = 'n';
      uVar10._1_1_ = ' ';
      uVar10._2_1_ = 'o';
      uVar10._3_1_ = 'n';
      goto LAB_002ae1ea;
    }
    pWord = pcVar5;
    cVar3 = *pcVar5;
  }
  builtin_strncpy(pMan->sError,"Cannot find symbol \' in the constant.",0x26);
LAB_002ae1ee:
  Ver_ParsePrintErrorMessage(pMan);
  return 0;
LAB_002ae16b:
  if (uVar6 == uVar4) {
    return 1;
  }
  bVar1 = pWord[uVar4 + 2];
  if (bVar1 - 0x30 < 2) {
    p = pMan->vNames;
    Entry = (void *)((ulong)bVar1 - 0x30);
  }
  else {
    if (bVar1 != 0x78) {
      builtin_strncpy(pMan->sError + 0x10,"arsing the binary constant.",0x1c);
      uVar7._0_1_ = 'H';
      uVar7._1_1_ = 'a';
      uVar7._2_1_ = 'v';
      uVar7._3_1_ = 'i';
      uVar8._0_1_ = 'n';
      uVar8._1_1_ = 'g';
      uVar8._2_1_ = ' ';
      uVar8._3_1_ = 'p';
      uVar9._0_1_ = 'r';
      uVar9._1_1_ = 'o';
      uVar9._2_1_ = 'b';
      uVar9._3_1_ = 'l';
      uVar10._0_1_ = 'e';
      uVar10._1_1_ = 'm';
      uVar10._2_1_ = ' ';
      uVar10._3_1_ = 'p';
LAB_002ae1ea:
      *(undefined4 *)pMan->sError = uVar7;
      *(undefined4 *)(pMan->sError + 4) = uVar8;
      *(undefined4 *)(pMan->sError + 8) = uVar9;
      *(undefined4 *)(pMan->sError + 0xc) = uVar10;
      goto LAB_002ae1ee;
    }
    p = pMan->vNames;
    Entry = (void *)0x0;
  }
  Vec_PtrPush(p,Entry);
  uVar4 = uVar4 + 1;
  goto LAB_002ae16b;
}

Assistant:

int Ver_ParseConstant( Ver_Man_t * pMan, char * pWord )
{
    int nBits, i;
    assert( pWord[0] >= '1' && pWord[1] <= '9' );
    nBits = atoi(pWord);
    // find the next symbol \'
    while ( *pWord && *pWord != '\'' )
        pWord++;
    if ( *pWord == 0 )
    {
        sprintf( pMan->sError, "Cannot find symbol \' in the constant." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    assert( *pWord == '\'' );
    pWord++;
    if ( *pWord != 'b' )
    {
        sprintf( pMan->sError, "Currently can only handle binary constants." );
        Ver_ParsePrintErrorMessage( pMan );
        return 0;
    }
    pWord++;
    // scan the bits
    Vec_PtrClear( pMan->vNames );
    for ( i = 0; i < nBits; i++ )
    {
      if ( pWord[i] != '0' && pWord[i] != '1' && pWord[i] != 'x' )
      {
         sprintf( pMan->sError, "Having problem parsing the binary constant." );
         Ver_ParsePrintErrorMessage( pMan );
         return 0;
      }
      if ( pWord[i] == 'x' ) 
          Vec_PtrPush( pMan->vNames, (void *)0 );
      else 
          Vec_PtrPush( pMan->vNames, (void *)(ABC_PTRUINT_T)(pWord[i]-'0') );
    }
    return 1;
}